

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmbench.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  xm_context_t **__len;
  xm_context_t **moddata;
  clock_t cVar3;
  clock_t cVar4;
  uint32_t rate;
  uint uVar5;
  xm_context_t **ctxp;
  undefined1 auVar6 [16];
  xm_context_t *ctx;
  xm_context_t *pxStack_20040;
  double dStack_20038;
  undefined8 uStack_20030;
  float afStack_20028 [32768];
  
  if (argc == 2) {
    iVar1 = open(argv[1],0);
    if (iVar1 == -1) {
      main_cold_7();
      goto LAB_001027fb;
    }
    __len = (xm_context_t **)lseek(iVar1,0,2);
    if (__len == (xm_context_t **)0xffffffffffffffff) {
      main_cold_6();
      goto LAB_001027fb;
    }
    ctxp = (xm_context_t **)0x0;
    argv = (char **)__len;
    moddata = (xm_context_t **)mmap((void *)0x0,(size_t)__len,1,1,iVar1,0);
    if (moddata != (xm_context_t **)0xffffffffffffffff) {
      ctxp = &pxStack_20040;
      argv = (char **)moddata;
      iVar2 = xm_create_context_safe(ctxp,(char *)moddata,(size_t)__len,48000);
      if (iVar2 != 0) {
        if (iVar2 != 1) {
          if (iVar2 != 2) goto LAB_00102830;
          main_cold_2();
          goto LAB_00102823;
        }
        main_cold_3();
      }
      munmap(moddata,(size_t)__len);
      close(iVar1);
      if (pxStack_20040 != (xm_context_t *)0x0) {
        cVar3 = clock();
        cVar4 = clock();
        dStack_20038 = 0.0;
        if (cVar4 - cVar3 < 5000000) {
          uVar5 = 0;
          do {
            uVar5 = uVar5 + 1;
            xm_generate_samples(pxStack_20040,afStack_20028,0x4000);
            cVar4 = clock();
          } while (cVar4 - cVar3 < 5000000);
          dStack_20038 = (double)uVar5 * 32768.0;
        }
        uStack_20030 = 0;
        cVar4 = clock();
        auVar6._8_8_ = (double)(cVar4 - cVar3);
        auVar6._0_8_ = dStack_20038;
        auVar6 = divpd(auVar6,_DAT_00107010);
        printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n"
               ,auVar6._0_4_,auVar6._8_8_,auVar6._0_8_ / auVar6._8_8_,48000);
        xm_free_context(pxStack_20040);
        return 0;
      }
LAB_001027fb:
      exit(1);
    }
  }
  else {
LAB_00102823:
    ctxp = (xm_context_t **)argv;
    main_cold_1();
  }
  main_cold_5();
LAB_00102830:
  main_cold_4();
  iVar1 = xm_create_context_safe(ctxp,(char *)argv,0xffffffffffffffff,rate);
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	float buffer[buffer_size];
	clock_t start, end;
	double cpu_time, gen_time;
	unsigned int num_passes = 0;

	if(argc != 2)
		FATAL("Usage: %s <filename>\n", argv[0]);

	create_context_from_file(&ctx, rate, argv[1]);
	if(ctx == NULL) exit(1);

	start = clock();
	while((clock() - start) < ideal_running_time * CLOCKS_PER_SEC) {
		++num_passes;
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
	}
	end = clock();

	cpu_time = (double)(end - start) / CLOCKS_PER_SEC;
	gen_time = (double)num_passes * (double)buffer_size / (channels * rate);
	printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n",
		   gen_time, rate, cpu_time, gen_time / cpu_time);

	xm_free_context(ctx);
	return 0;
}